

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::BasicVariousTessLevelsPosAttrCase::init
          (BasicVariousTessLevelsPosAttrCase *this,EVP_PKEY_CTX *ctx)

{
  Context *this_00;
  bool bVar1;
  RenderTarget *renderTarget;
  Context *context;
  ShaderProgram *pSVar2;
  RenderContext *renderCtx;
  TestLog *log;
  undefined7 extraout_var;
  TestError *this_01;
  char *code;
  char *local_1c0;
  SharedPtr<const_glu::ShaderProgram> local_1b0;
  string local_1a0;
  ShaderSource local_180;
  allocator<char> local_141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  undefined1 local_100 [8];
  string tessellationControlTemplate;
  ProgramSources sources;
  BasicVariousTessLevelsPosAttrCase *this_local;
  
  checkTessellationSupport((this->super_TestCase).m_context);
  renderTarget = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize(renderTarget,0x100);
  code = (char *)(ulong)this->m_spacing;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            ((undefined1 *)((long)&tessellationControlTemplate.field_2 + 8),this,
             (ulong)this->m_primitiveType,code,"in_tc_position");
  if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
    local_1c0 = "3";
  }
  else {
    local_1c0 = "4";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,local_1c0,&local_141);
  std::operator+(&local_120,
                 "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices = ",
                 &local_140);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                 &local_120,
                 ") out;\n\nin highp vec2 in_tc_position[];\n\nout highp vec2 in_te_position[];\n\nuniform mediump float u_tessLevelInner0;\nuniform mediump float u_tessLevelInner1;\nuniform mediump float u_tessLevelOuter0;\nuniform mediump float u_tessLevelOuter1;\nuniform mediump float u_tessLevelOuter2;\nuniform mediump float u_tessLevelOuter3;\n\nvoid main (void)\n{\n\tin_te_position[gl_InvocationID] = in_tc_position[gl_InvocationID];\n\n\tgl_TessLevelInner[0] = u_tessLevelInner0;\n\tgl_TessLevelInner[1] = u_tessLevelInner1;\n\n\tgl_TessLevelOuter[0] = u_tessLevelOuter0;\n\tgl_TessLevelOuter[1] = u_tessLevelOuter1;\n\tgl_TessLevelOuter[2] = u_tessLevelOuter2;\n\tgl_TessLevelOuter[3] = u_tessLevelOuter3;\n}\n"
                );
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  this_00 = (this->super_TestCase).m_context;
  context = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_1a0,(_anonymous_namespace_ *)this_00,context,code);
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)&local_180,&local_1a0);
  glu::ProgramSources::operator<<
            ((ProgramSources *)((long)&tessellationControlTemplate.field_2 + 8),&local_180);
  glu::TessellationControlSource::~TessellationControlSource
            ((TessellationControlSource *)&local_180);
  std::__cxx11::string::~string((string *)&local_1a0);
  pSVar2 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ShaderProgram::ShaderProgram
            (pSVar2,renderCtx,(ProgramSources *)((long)&tessellationControlTemplate.field_2 + 8));
  de::SharedPtr<const_glu::ShaderProgram>::SharedPtr(&local_1b0,pSVar2);
  de::SharedPtr<const_glu::ShaderProgram>::operator=(&this->m_program,&local_1b0);
  de::SharedPtr<const_glu::ShaderProgram>::~SharedPtr(&local_1b0);
  std::__cxx11::string::~string((string *)local_100);
  glu::ProgramSources::~ProgramSources
            ((ProgramSources *)((long)&tessellationControlTemplate.field_2 + 8));
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pSVar2 = de::SharedPtr<const_glu::ShaderProgram>::operator*(&this->m_program);
  glu::operator<<(log,pSVar2);
  pSVar2 = de::SharedPtr<const_glu::ShaderProgram>::operator->(&this->m_program);
  bVar1 = glu::ShaderProgram::isOk(pSVar2);
  if (!bVar1) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Program compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
               ,0x935);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

void BasicVariousTessLevelsPosAttrCase::init (void)
{
	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	{
		glu::ProgramSources sources = makeSources(m_primitiveType, m_spacing, "in_tc_position");
		DE_ASSERT(sources.sources[glu::SHADERTYPE_TESSELLATION_CONTROL].empty());

		std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
													 "${TESSELLATION_SHADER_REQUIRE}\n"
													"\n"
													"layout (vertices = " + string(m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? "3" : "4") + ") out;\n"
													"\n"
													"in highp vec2 in_tc_position[];\n"
													"\n"
													"out highp vec2 in_te_position[];\n"
													"\n"
													"uniform mediump float u_tessLevelInner0;\n"
													"uniform mediump float u_tessLevelInner1;\n"
													"uniform mediump float u_tessLevelOuter0;\n"
													"uniform mediump float u_tessLevelOuter1;\n"
													"uniform mediump float u_tessLevelOuter2;\n"
													"uniform mediump float u_tessLevelOuter3;\n"
													"\n"
													"void main (void)\n"
													"{\n"
													"	in_te_position[gl_InvocationID] = in_tc_position[gl_InvocationID];\n"
													"\n"
													"	gl_TessLevelInner[0] = u_tessLevelInner0;\n"
													"	gl_TessLevelInner[1] = u_tessLevelInner1;\n"
													"\n"
													"	gl_TessLevelOuter[0] = u_tessLevelOuter0;\n"
													"	gl_TessLevelOuter[1] = u_tessLevelOuter1;\n"
													"	gl_TessLevelOuter[2] = u_tessLevelOuter2;\n"
													"	gl_TessLevelOuter[3] = u_tessLevelOuter3;\n"
													"}\n");

		sources << glu::TessellationControlSource(specializeShader(m_context, tessellationControlTemplate.c_str()));

		m_program = SharedPtr<const ShaderProgram>(new glu::ShaderProgram(m_context.getRenderContext(), sources));
	}

	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Program compilation failed");
}